

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

_Bool Next_Choice(FIELDTYPE *typ,FIELD *field,TypeArgument *argp)

{
  _Bool _Var1;
  _Bool local_29;
  TypeArgument *argp_local;
  FIELD *field_local;
  FIELDTYPE *typ_local;
  
  if ((typ == (FIELDTYPE *)0x0) || ((typ->status & 4) == 0)) {
    typ_local._7_1_ = false;
  }
  else if ((typ->status & 1) == 0) {
    if (typ->next == (_func__Bool_FIELD_ptr_void_ptr *)0x0) {
      __assert_fail("typ->next != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CursesDialog/form/frm_driver.c"
                    ,0xa1e,"_Bool Next_Choice(FIELDTYPE *, FIELD *, TypeArgument *)");
    }
    typ_local._7_1_ = (*typ->next)(field,argp);
  }
  else {
    if (argp == (TypeArgument *)0x0) {
      __assert_fail("argp != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CursesDialog/form/frm_driver.c"
                    ,0xa17,"_Bool Next_Choice(FIELDTYPE *, FIELD *, TypeArgument *)");
    }
    _Var1 = Next_Choice(typ->left,field,argp->left);
    local_29 = true;
    if (!_Var1) {
      local_29 = Next_Choice(typ->right,field,argp->right);
    }
    typ_local._7_1_ = local_29;
  }
  return typ_local._7_1_;
}

Assistant:

static bool Next_Choice(FIELDTYPE * typ, FIELD *field, TypeArgument *argp)
{
  if (!typ || !(typ->status & _HAS_CHOICE)) 
    return FALSE;

  if (typ->status & _LINKED_TYPE)
    {
      assert(argp != 0);
      return(
             Next_Choice(typ->left ,field,argp->left) ||
             Next_Choice(typ->right,field,argp->right) );
    } 
  else
    {
      assert(typ->next != 0);
      return typ->next(field,(void *)argp);
    }
}